

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  pointer *ppUVar1;
  iterator __position;
  UnknownField field;
  UnknownField local_18;
  
  local_18.type_ = 3;
  local_18.number_ = number;
  local_18.data_.group_ = (UnknownFieldSet *)operator_new(0x20);
  ((local_18.data_.group_)->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&((local_18.data_.group_)->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_18.data_.group_)->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &((local_18.data_.group_)->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  __position._M_current =
       (this->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>
              ((vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                *)this,__position,&local_18);
  }
  else {
    (__position._M_current)->number_ = local_18.number_;
    (__position._M_current)->type_ = local_18.type_;
    ((__position._M_current)->data_).group_ = (UnknownFieldSet *)local_18.data_;
    ppUVar1 = &(this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return (string *)local_18.data_.varint_;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}